

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

int4 __thiscall ParamEntry::getSlot(ParamEntry *this,Address *addr,int4 skip)

{
  bool bVar1;
  int iVar2;
  uintb uVar3;
  ulong uVar4;
  int4 baseslot;
  uintb diff;
  int4 res;
  int4 skip_local;
  Address *addr_local;
  ParamEntry *this_local;
  
  diff._0_4_ = this->group;
  if (this->alignment == 0) {
    if (skip != 0) {
      diff._0_4_ = this->groupsize + -1 + (int)diff;
    }
  }
  else {
    uVar3 = Address::getOffset(addr);
    uVar4 = (uVar3 + (long)skip) - this->addressbase;
    iVar2 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                 (long)this->alignment);
    bVar1 = isReverseStack(this);
    if (bVar1) {
      iVar2 = (this->numslots + -1) - iVar2;
    }
    diff._0_4_ = iVar2 + (int)diff;
  }
  return (int)diff;
}

Assistant:

int4 ParamEntry::getSlot(const Address &addr,int4 skip) const

{
  int4 res = group;
  if (alignment != 0) {
    uintb diff = addr.getOffset() + skip - addressbase;
    int4 baseslot = (int4)diff / alignment;
    if (isReverseStack())
      res += (numslots -1) - baseslot;
    else
      res += baseslot;
  }
  else if (skip != 0) {
    res += (groupsize-1);
  }
  return res;
}